

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

Variable __thiscall LiteScript::CreateCallback(LiteScript *this,Memory *memory,uint id)

{
  Object *pOVar1;
  uint *extraout_RDX;
  Variable VVar2;
  Callback CStack_c8;
  
  Memory::Create((Memory *)this,(Type *)memory);
  Callback::Callback(&CStack_c8,memory,id);
  pOVar1 = Variable::operator->((Variable *)this);
  Callback::operator=((Callback *)pOVar1->data,&CStack_c8);
  Callback::~Callback(&CStack_c8);
  VVar2.nb_ref = extraout_RDX;
  VVar2.obj = (Object *)this;
  return VVar2;
}

Assistant:

LiteScript::Variable LiteScript::CreateCallback(Memory &memory, unsigned int id) {
    Variable res = memory.Create(Type::CALLBACK);
    res->GetData<Callback>() = Callback(memory, id);
    return res;
}